

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O0

bool SourceMap::Find(LPCSTR path,size_t pathLength,AutoString **out)

{
  int iVar1;
  LPCSTR __s1;
  FileNode *local_30;
  FileNode *node;
  AutoString **out_local;
  size_t pathLength_local;
  LPCSTR path_local;
  
  local_30 = root;
  while( true ) {
    if (local_30 == (FileNode *)0x0) {
      return false;
    }
    __s1 = AutoString::GetString(&local_30->path);
    iVar1 = strncmp(__s1,path,pathLength);
    if (iVar1 == 0) break;
    local_30 = local_30->next;
  }
  *out = &local_30->data;
  return true;
}

Assistant:

static bool Find(LPCSTR path, size_t pathLength, AutoString ** out)
    {
        FileNode * node = root;
        while(node != nullptr)
        {
            if (strncmp(node->path.GetString(), path, pathLength) == 0)
            {
                *out = &(node->data);
                return true;
            }
            node = node->next;
        }
        return false;
    }